

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O2

bool __thiscall
xercesc_4_0::TraverseSchema::validateRedefineNameChange
          (TraverseSchema *this,DOMElement *redefineChildElem,XMLCh *redefineChildComponentName,
          XMLCh *redefineChildTypeName,int redefineNameCounter,SchemaInfo *redefiningSchemaInfo)

{
  XMLBuffer *this_00;
  XMLStringPool *pXVar1;
  bool bVar2;
  int iVar3;
  int key2;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  DatatypeValidator *pDVar6;
  DOMNode *pDVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  XMLCh *pXVar8;
  XMLCh *pXVar9;
  XMLCh *pXVar10;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  char16_t *valueToAdopt;
  undefined1 *key1;
  RefHash2KeysTableOf<char16_t,_xercesc_4_0::StringHasher> *this_01;
  
  iVar3 = (*(this->fStringPool->super_XSerializable)._vptr_XSerializable[5])
                    (this->fStringPool,redefineChildTypeName);
  this_00 = &this->fBuffer;
  XMLBuffer::set(this_00,this->fTargetNSURIString);
  XMLBuffer::append(this_00,L',');
  XMLBuffer::append(this_00,redefineChildTypeName);
  pXVar1 = this->fStringPool;
  (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
  key2 = (*(pXVar1->super_XSerializable)._vptr_XSerializable[5])();
  iVar4 = (*(this->fStringPool->super_XSerializable)._vptr_XSerializable[10])();
  pXVar8 = (XMLCh *)CONCAT44(extraout_var,iVar4);
  this->fSchemaInfo = redefiningSchemaInfo;
  bVar2 = XMLString::equals(redefineChildComponentName,(XMLCh *)SchemaSymbols::fgELT_SIMPLETYPE);
  if (!bVar2) {
    bVar2 = XMLString::equals(redefineChildComponentName,(XMLCh *)SchemaSymbols::fgELT_COMPLEXTYPE);
    if (bVar2) {
      bVar2 = RefHashTableOf<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher>::containsKey
                        (this->fComplexTypeRegistry,pXVar8);
      if (bVar2) {
        return false;
      }
      pDVar7 = &XUtil::getFirstChildElement(&redefineChildElem->super_DOMNode)->super_DOMNode;
      if (pDVar7 != (DOMNode *)0x0) {
        iVar4 = (*pDVar7->_vptr_DOMNode[0x18])(pDVar7);
        bVar2 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_02,iVar4),
                                  (XMLCh *)SchemaSymbols::fgELT_ANNOTATION);
        if ((!bVar2) ||
           (pDVar7 = &XUtil::getNextSiblingElement(pDVar7)->super_DOMNode, pDVar7 != (DOMNode *)0x0)
           ) {
          redefineChildElem = (DOMElement *)pDVar7;
          pDVar7 = &XUtil::getFirstChildElement(&redefineChildElem->super_DOMNode)->super_DOMNode;
          if (pDVar7 != (DOMNode *)0x0) {
            iVar4 = (*pDVar7->_vptr_DOMNode[0x18])(pDVar7);
            bVar2 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_03,iVar4),
                                      (XMLCh *)SchemaSymbols::fgELT_ANNOTATION);
            if ((!bVar2) ||
               (pDVar7 = &XUtil::getNextSiblingElement(pDVar7)->super_DOMNode,
               pDVar7 != (DOMNode *)0x0)) {
              redefineChildElem = (DOMElement *)pDVar7;
              iVar4 = (*(redefineChildElem->super_DOMNode)._vptr_DOMNode[0x18])(redefineChildElem);
              bVar2 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_04,iVar4),
                                        (XMLCh *)SchemaSymbols::fgELT_RESTRICTION);
              if ((!bVar2) &&
                 (bVar2 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_04,iVar4),
                                            (XMLCh *)SchemaSymbols::fgELT_EXTENSION), !bVar2)) {
                iVar3 = 0x7a;
                goto LAB_0031f754;
              }
              pXVar8 = getElementAttValue(this,redefineChildElem,(XMLCh *)SchemaSymbols::fgATT_BASE,
                                          QName);
              pXVar9 = getPrefix(this,pXVar8);
              pXVar10 = getLocalPart(this,pXVar8);
              pXVar9 = resolvePrefixToURI(this,redefineChildElem,pXVar9);
              iVar4 = this->fTargetNSURI;
              iVar5 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])
                                (this->fURIStringPool,pXVar9);
              if ((iVar4 != iVar5) ||
                 (iVar4 = (*(this->fStringPool->super_XSerializable)._vptr_XSerializable[5])
                                    (this->fStringPool,pXVar10), iVar4 != iVar3)) {
                iVar3 = 0x7b;
                goto LAB_0031f754;
              }
              getRedefineNewTypeName(this,pXVar8,redefineNameCounter,this_00);
              (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
              (*(redefineChildElem->super_DOMNode)._vptr_DOMNode[0x2c])
                        (redefineChildElem,SchemaSymbols::fgATT_BASE);
              this_01 = this->fRedefineComponents;
              key1 = SchemaSymbols::fgELT_COMPLEXTYPE;
              goto LAB_0031f68a;
            }
          }
          iVar3 = 0x7a;
          goto LAB_0031f754;
        }
      }
      iVar3 = 0x7a;
      goto LAB_0031f754;
    }
    bVar2 = XMLString::equals(redefineChildComponentName,(XMLCh *)SchemaSymbols::fgELT_GROUP);
    if (bVar2) {
      bVar2 = RefHashTableOf<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher>::containsKey
                        (this->fGroupRegistry,pXVar8);
      if (bVar2) {
        return false;
      }
      iVar3 = changeRedefineGroup(this,redefineChildElem,redefineChildComponentName,
                                  redefineChildTypeName,redefineNameCounter);
      if (1 < iVar3) {
        iVar3 = 0x7e;
        goto LAB_0031f754;
      }
      this_01 = this->fRedefineComponents;
      if (iVar3 == 0) {
        valueToAdopt = this->fSchemaInfo->fCurrentSchemaURL;
        key1 = SchemaSymbols::fgELT_GROUP;
        goto LAB_0031f784;
      }
      key1 = SchemaSymbols::fgELT_GROUP;
    }
    else {
      bVar2 = XMLString::equals(redefineChildComponentName,
                                (XMLCh *)SchemaSymbols::fgELT_ATTRIBUTEGROUP);
      if (!bVar2) {
        reportSchemaError(this,redefineChildElem,(XMLCh *)XMLUni::fgXMLErrDomain,0x80,
                          redefineChildComponentName,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
        return false;
      }
      bVar2 = RefHashTableOf<xercesc_4_0::XercesAttGroupInfo,_xercesc_4_0::StringHasher>::
              containsKey(this->fAttGroupRegistry,redefineChildTypeName);
      if (bVar2) {
        return false;
      }
      iVar3 = changeRedefineGroup(this,redefineChildElem,redefineChildComponentName,
                                  redefineChildTypeName,redefineNameCounter);
      if (1 < iVar3) {
        iVar3 = 0x7f;
        goto LAB_0031f754;
      }
      this_01 = this->fRedefineComponents;
      if (iVar3 == 0) {
        valueToAdopt = this->fSchemaInfo->fCurrentSchemaURL;
        key1 = SchemaSymbols::fgELT_ATTRIBUTEGROUP;
        goto LAB_0031f784;
      }
      key1 = SchemaSymbols::fgELT_ATTRIBUTEGROUP;
    }
LAB_0031f68a:
    valueToAdopt = (char16_t *)0x0;
LAB_0031f784:
    RefHash2KeysTableOf<char16_t,_xercesc_4_0::StringHasher>::put(this_01,key1,key2,valueToAdopt);
    return true;
  }
  pDVar6 = DatatypeValidatorFactory::getDatatypeValidator(this->fDatatypeRegistry,pXVar8);
  if (pDVar6 != (DatatypeValidator *)0x0) {
    return false;
  }
  pDVar7 = &XUtil::getFirstChildElement(&redefineChildElem->super_DOMNode)->super_DOMNode;
  if (pDVar7 != (DOMNode *)0x0) {
    iVar4 = (*pDVar7->_vptr_DOMNode[0x18])(pDVar7);
    bVar2 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_00,iVar4),
                              (XMLCh *)SchemaSymbols::fgELT_ANNOTATION);
    if ((!bVar2) ||
       (pDVar7 = &XUtil::getNextSiblingElement(pDVar7)->super_DOMNode, pDVar7 != (DOMNode *)0x0)) {
      redefineChildElem = (DOMElement *)pDVar7;
      iVar4 = (*(redefineChildElem->super_DOMNode)._vptr_DOMNode[0x18])(redefineChildElem);
      bVar2 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_01,iVar4),
                                (XMLCh *)SchemaSymbols::fgELT_RESTRICTION);
      if (!bVar2) {
        iVar3 = 0x78;
        goto LAB_0031f754;
      }
      pXVar8 = getElementAttValue(this,redefineChildElem,(XMLCh *)SchemaSymbols::fgATT_BASE,QName);
      pXVar9 = getPrefix(this,pXVar8);
      pXVar10 = getLocalPart(this,pXVar8);
      pXVar9 = resolvePrefixToURI(this,redefineChildElem,pXVar9);
      iVar4 = this->fTargetNSURI;
      iVar5 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])
                        (this->fURIStringPool,pXVar9);
      if ((iVar4 != iVar5) ||
         (iVar4 = (*(this->fStringPool->super_XSerializable)._vptr_XSerializable[5])
                            (this->fStringPool,pXVar10), iVar4 != iVar3)) {
        iVar3 = 0x79;
        goto LAB_0031f754;
      }
      getRedefineNewTypeName(this,pXVar8,redefineNameCounter,this_00);
      (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
      (*(redefineChildElem->super_DOMNode)._vptr_DOMNode[0x2c])
                (redefineChildElem,SchemaSymbols::fgATT_BASE);
      this_01 = this->fRedefineComponents;
      key1 = SchemaSymbols::fgELT_SIMPLETYPE;
      goto LAB_0031f68a;
    }
  }
  iVar3 = 0x78;
LAB_0031f754:
  reportSchemaError(this,redefineChildElem,(XMLCh *)XMLUni::fgXMLErrDomain,iVar3);
  return false;
}

Assistant:

bool TraverseSchema::validateRedefineNameChange(const DOMElement* const redefineChildElem,
                                                const XMLCh* const redefineChildComponentName,
                                                const XMLCh* const redefineChildTypeName,
                                                const int redefineNameCounter,
                                                SchemaInfo* const redefiningSchemaInfo) {

    const XMLCh* baseTypeName = 0;
    unsigned int typeNameId = fStringPool->addOrFind(redefineChildTypeName);

    fBuffer.set(fTargetNSURIString);
    fBuffer.append(chComma);
    fBuffer.append(redefineChildTypeName);

    int   fullTypeNameId = fStringPool->addOrFind(fBuffer.getRawBuffer());
    const XMLCh* typeNameStr = fStringPool->getValueForId(fullTypeNameId);

    restoreSchemaInfo(redefiningSchemaInfo);

    if (XMLString::equals(redefineChildComponentName,SchemaSymbols::fgELT_SIMPLETYPE)) {

        if (fDatatypeRegistry->getDatatypeValidator(typeNameStr)) {
            return false;
        }

        DOMElement* grandKid = XUtil::getFirstChildElement(redefineChildElem);

        if (grandKid && XMLString::equals(grandKid->getLocalName(), SchemaSymbols::fgELT_ANNOTATION)) {
            grandKid = XUtil::getNextSiblingElement(grandKid);
        }

        if (grandKid == 0) {

            reportSchemaError(redefineChildElem, XMLUni::fgXMLErrDomain, XMLErrs::Redefine_InvalidSimpleType);
            return false;
        }
        else if(!XMLString::equals(grandKid->getLocalName(), SchemaSymbols::fgELT_RESTRICTION)) {

            reportSchemaError(grandKid, XMLUni::fgXMLErrDomain, XMLErrs::Redefine_InvalidSimpleType);
            return false;
        }

        baseTypeName = getElementAttValue(grandKid, SchemaSymbols::fgATT_BASE, DatatypeValidator::QName);
        const XMLCh* prefix = getPrefix(baseTypeName);
        const XMLCh* localPart = getLocalPart(baseTypeName);
        const XMLCh* uriStr = resolvePrefixToURI(grandKid, prefix);

        if (fTargetNSURI != (int) fURIStringPool->addOrFind(uriStr)
            || fStringPool->addOrFind(localPart) != typeNameId) {
            reportSchemaError(grandKid, XMLUni::fgXMLErrDomain, XMLErrs::Redefine_InvalidSimpleTypeBase);
            return false;
        }

        // now we have to do the renaming...
        getRedefineNewTypeName(baseTypeName, redefineNameCounter, fBuffer);
        grandKid->setAttribute(SchemaSymbols::fgATT_BASE, fBuffer.getRawBuffer());
        fRedefineComponents->put((void*) SchemaSymbols::fgELT_SIMPLETYPE,
                                 fullTypeNameId, 0);
    }
    else if (XMLString::equals(redefineChildComponentName,SchemaSymbols::fgELT_COMPLEXTYPE)) {

        if (fComplexTypeRegistry->containsKey(typeNameStr)) {
            return false;
        }

        DOMElement* grandKid = XUtil::getFirstChildElement(redefineChildElem);

        if (grandKid && XMLString::equals(grandKid->getLocalName(), SchemaSymbols::fgELT_ANNOTATION)) {
            grandKid = XUtil::getNextSiblingElement(grandKid);
        }

        if (grandKid == 0) {
            reportSchemaError(redefineChildElem, XMLUni::fgXMLErrDomain, XMLErrs::Redefine_InvalidComplexType);
            return false;
        } else {

            // have to go one more level down; let another pass worry whether complexType is valid.
            DOMElement* greatGrandKid = XUtil::getFirstChildElement(grandKid);

            if (greatGrandKid != 0 &&
                XMLString::equals(greatGrandKid->getLocalName(), SchemaSymbols::fgELT_ANNOTATION)) {
                greatGrandKid = XUtil::getNextSiblingElement(greatGrandKid);
            }

            if (greatGrandKid == 0) {

                reportSchemaError(grandKid, XMLUni::fgXMLErrDomain, XMLErrs::Redefine_InvalidComplexType);
                return false;
            } else {

                const XMLCh* greatGrandKidName = greatGrandKid->getLocalName();

                if (!XMLString::equals(greatGrandKidName, SchemaSymbols::fgELT_RESTRICTION)
                    && !XMLString::equals(greatGrandKidName, SchemaSymbols::fgELT_EXTENSION)) {

                    reportSchemaError(greatGrandKid, XMLUni::fgXMLErrDomain, XMLErrs::Redefine_InvalidComplexType);
                    return false;
                }

                baseTypeName = getElementAttValue(greatGrandKid, SchemaSymbols::fgATT_BASE, DatatypeValidator::QName);
                const XMLCh* prefix = getPrefix(baseTypeName);
                const XMLCh* localPart = getLocalPart(baseTypeName);
                const XMLCh* uriStr = resolvePrefixToURI(greatGrandKid, prefix);

                if (fTargetNSURI != (int) fURIStringPool->addOrFind(uriStr)
                    || fStringPool->addOrFind(localPart) != typeNameId) {
                    reportSchemaError(greatGrandKid, XMLUni::fgXMLErrDomain, XMLErrs::Redefine_InvalidComplexTypeBase);
                    return false;
                }

                // now we have to do the renaming...
                getRedefineNewTypeName(baseTypeName, redefineNameCounter, fBuffer);
                greatGrandKid->setAttribute(SchemaSymbols::fgATT_BASE, fBuffer.getRawBuffer());
                fRedefineComponents->put((void*) SchemaSymbols::fgELT_COMPLEXTYPE,
                                         fullTypeNameId, 0);
            }
        }
    }
    else if (XMLString::equals(redefineChildComponentName, SchemaSymbols::fgELT_GROUP)) {

        if (fGroupRegistry->containsKey(typeNameStr)) {
            return false;
        }

        int groupRefCount = changeRedefineGroup(redefineChildElem, redefineChildComponentName,
                                                redefineChildTypeName, redefineNameCounter);

        if (groupRefCount > 1) {

            reportSchemaError(redefineChildElem, XMLUni::fgXMLErrDomain, XMLErrs::Redefine_GroupRefCount);
            return false;
        }
        else if (groupRefCount == 0) {
            // put a dummy value, default is null.
            // when processing groups, we will check that table, if a value
            // is found, we need to do a particle derivation check.
            fRedefineComponents->put((void*) SchemaSymbols::fgELT_GROUP,
                                     fullTypeNameId, fSchemaInfo->getCurrentSchemaURL());
        }
        else {
            fRedefineComponents->put((void*) SchemaSymbols::fgELT_GROUP, fullTypeNameId, 0);
        }
    }
    else if (XMLString::equals(redefineChildComponentName, SchemaSymbols::fgELT_ATTRIBUTEGROUP)) {

        if (fAttGroupRegistry->containsKey(redefineChildTypeName)) {
            return false;
        }

        int attGroupRefCount = changeRedefineGroup(redefineChildElem, redefineChildComponentName,
                                                   redefineChildTypeName, redefineNameCounter);

        if (attGroupRefCount > 1) {

            reportSchemaError(redefineChildElem, XMLUni::fgXMLErrDomain, XMLErrs::Redefine_AttGroupRefCount);
            return false;
        }
        else if (attGroupRefCount == 0) {
            // put a dummy value, default is null.
            // when processing attributeGroups, we will check that table, if
            // a value is found, we need to check for attribute derivation ok
            // (by restriction)
            fRedefineComponents->put((void*) SchemaSymbols::fgELT_ATTRIBUTEGROUP,
                                     fullTypeNameId, fSchemaInfo->getCurrentSchemaURL());
        }
        else {
            fRedefineComponents->put((void*) SchemaSymbols::fgELT_ATTRIBUTEGROUP, fullTypeNameId, 0);
        }
    }
    else {
        reportSchemaError
        (
            redefineChildElem
            , XMLUni::fgXMLErrDomain
            , XMLErrs::Redefine_InvalidChild
            , redefineChildComponentName
        );
        return false;
    }

    return true;
}